

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChessMove.h
# Opt level: O0

ChessMove * __thiscall senjo::ChessMove::ToString_abi_cxx11_(ChessMove *this)

{
  bool bVar1;
  int iVar2;
  long in_RSI;
  Square local_70 [8];
  Square local_50 [13];
  undefined1 local_19;
  ChessMove *this_local;
  string *str;
  
  local_19 = 0;
  this_local = this;
  std::__cxx11::string::string((string *)this);
  bVar1 = Square::IsValid((Square *)(in_RSI + 4));
  if (((bVar1) && (bVar1 = Square::IsValid((Square *)(in_RSI + 8)), bVar1)) &&
     (bVar1 = Square::operator!=((Square *)(in_RSI + 4),(Square *)(in_RSI + 8)), bVar1)) {
    Square::ToString_abi_cxx11_(local_50);
    std::__cxx11::string::operator+=((string *)this,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    Square::ToString_abi_cxx11_(local_70);
    std::__cxx11::string::operator+=((string *)this,(string *)local_70);
    std::__cxx11::string::~string((string *)local_70);
    if (*(char *)(in_RSI + 1) != '\0') {
      iVar2 = tolower((int)*(char *)(in_RSI + 1));
      std::__cxx11::string::operator+=((string *)this,(char)iVar2);
    }
  }
  return this;
}

Assistant:

std::string ToString() const {
    std::string str;
    if (from.IsValid() && to.IsValid() && (from != to)) {
      str += from.ToString();
      str += to.ToString();
      if (promo) {
        str += tolower(promo);
      }
    }
    return str;
  }